

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

GLuint deqp::gls::MultiTextureSamplerTest::createTextureCube(Functions *gl,int id)

{
  glTexImage2DFunc p_Var1;
  GLuint GVar2;
  GLenum GVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  PixelBufferAccess *pPVar7;
  void *pvVar8;
  CubeFace local_318;
  deUint32 target;
  int face;
  Vector<float,_4> local_304;
  Vector<float,_4> local_2f4;
  Vector<float,_4> local_2e4;
  Vector<float,_4> local_2d4;
  Vector<float,_4> local_2c4;
  Vector<float,_4> local_2b4;
  Vector<float,_4> local_2a4;
  Vector<float,_4> local_294;
  Vector<float,_4> local_284;
  Vector<float,_4> local_274;
  Vector<float,_4> local_264;
  Vector<float,_4> local_254;
  Vector<float,_4> local_244;
  Vector<float,_4> local_234;
  Vector<float,_4> local_224;
  Vector<float,_4> local_214;
  Vector<float,_4> local_204;
  Vector<float,_4> local_1f4;
  Vector<float,_4> local_1e4;
  Vector<float,_4> local_1d4;
  Vector<float,_4> local_1c4;
  Vector<float,_4> local_1b4;
  Vector<float,_4> local_1a4;
  TextureFormat local_188;
  undefined1 local_180 [8];
  TextureCube refTexture;
  GLuint texture;
  int id_local;
  Functions *gl_local;
  
  refTexture.m_view.m_levels[5]._0_4_ = 0xffffffff;
  refTexture.m_view.m_levels[5]._4_4_ = id;
  tcu::TextureFormat::TextureFormat(&local_188,RGBA,UNORM_INT8);
  tcu::TextureCube::TextureCube((TextureCube *)local_180,&local_188,0x20);
  (*gl->genTextures)(1,(GLuint *)(refTexture.m_view.m_levels + 5));
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3c0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_POSITIVE_X,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_POSITIVE_Y,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_POSITIVE_Z,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_NEGATIVE_X,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_NEGATIVE_Y,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_NEGATIVE_Z,0);
  if (refTexture.m_view.m_levels[5]._4_4_ == 0) {
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_X);
    tcu::Vector<float,_4>::Vector(&local_1a4,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_1b4,0.5,0.5,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_1a4,&local_1b4);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_Y);
    tcu::Vector<float,_4>::Vector(&local_1c4,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_1d4,0.5,0.5,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_1c4,&local_1d4);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_Z);
    tcu::Vector<float,_4>::Vector(&local_1e4,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_1f4,0.5,0.5,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_1e4,&local_1f4);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_X);
    tcu::Vector<float,_4>::Vector(&local_204,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_214,0.5,0.5,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_204,&local_214);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_Y);
    tcu::Vector<float,_4>::Vector(&local_224,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_234,0.5,0.5,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_224,&local_234);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_Z);
    tcu::Vector<float,_4>::Vector(&local_244,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_254,0.5,0.5,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_244,&local_254);
  }
  else if (refTexture.m_view.m_levels[5]._4_4_ == 1) {
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_X);
    tcu::Vector<float,_4>::Vector(&local_264,0.5,0.5,0.5,0.5);
    tcu::Vector<float,_4>::Vector(&local_274,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_264,&local_274);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_Y);
    tcu::Vector<float,_4>::Vector(&local_284,0.5,0.5,0.5,0.5);
    tcu::Vector<float,_4>::Vector(&local_294,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_284,&local_294);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_Z);
    tcu::Vector<float,_4>::Vector(&local_2a4,0.5,0.5,0.5,0.5);
    tcu::Vector<float,_4>::Vector(&local_2b4,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_2a4,&local_2b4);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_X);
    tcu::Vector<float,_4>::Vector(&local_2c4,0.5,0.5,0.5,0.5);
    tcu::Vector<float,_4>::Vector(&local_2d4,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_2c4,&local_2d4);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_Y);
    tcu::Vector<float,_4>::Vector(&local_2e4,0.5,0.5,0.5,0.5);
    tcu::Vector<float,_4>::Vector(&local_2f4,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_2e4,&local_2f4);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_Z);
    tcu::Vector<float,_4>::Vector(&local_304,0.5,0.5,0.5,0.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&target,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_304,(Vec4 *)&target);
  }
  (*gl->bindTexture)(0x8513,(GLuint)refTexture.m_view.m_levels[5]);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_CUBE_MAP, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3e2);
  for (local_318 = CUBEFACE_NEGATIVE_X; (int)local_318 < 6;
      local_318 = local_318 + CUBEFACE_POSITIVE_X) {
    dVar4 = glu::getGLCubeFace(local_318);
    p_Var1 = gl->texImage2D;
    iVar5 = tcu::TextureCube::getSize((TextureCube *)local_180);
    iVar6 = tcu::TextureCube::getSize((TextureCube *)local_180);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,local_318);
    pvVar8 = tcu::PixelBufferAccess::getDataPtr(pPVar7);
    (*p_Var1)(dVar4,0,0x8058,iVar5,iVar6,0,0x1908,0x1401,pvVar8);
  }
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3e9);
  (*gl->generateMipmap)(0x8513);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenerateMipmap(GL_TEXTURE_CUBE_MAP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3ec);
  (*gl->bindTexture)(0x8513,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_CUBE_MAP, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3ee);
  GVar2 = (GLuint)refTexture.m_view.m_levels[5];
  tcu::TextureCube::~TextureCube((TextureCube *)local_180);
  return GVar2;
}

Assistant:

GLuint MultiTextureSamplerTest::createTextureCube (const glw::Functions& gl, int id)
{
	GLuint				texture		= (GLuint)-1;
	tcu::TextureCube	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), CUBEMAP_SIZE);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures(1, &texture)");

	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Z, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Z, 0);

	switch (id)
	{
		case 0:
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			break;

		case 1:
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_X), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Y), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Z), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_X), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Y), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Z), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			break;

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, texture)");

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		const deUint32 target = glu::getGLCubeFace((tcu::CubeFace)face);
		gl.texImage2D(target, 0, GL_RGBA8, refTexture.getSize(), refTexture.getSize(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevelFace(0, (tcu::CubeFace)face).getDataPtr());
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed");

	gl.generateMipmap(GL_TEXTURE_CUBE_MAP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_CUBE_MAP)");
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, 0)");

	return texture;
}